

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execDivuMusashi<(moira::Core)0,(moira::Instr)55,(moira::Mode)9,2>
          (Moira *this,u16 opcode,bool *divByZero)

{
  uint uVar1;
  u32 uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar2 = computeEA<(moira::Core)0,(moira::Mode)9,2,0ull>(this,opcode & 7);
  uVar2 = read<(moira::Core)0,(moira::AddrSpace)2,2,0ull>(this,uVar2);
  if (uVar2 == 0) {
    execException<(moira::Core)0>(this,DIVIDE_BY_ZERO,0);
    *divByZero = true;
  }
  else {
    uVar5 = (ulong)(opcode >> 9 & 7);
    uVar1 = *(uint *)((long)&(this->reg).field_3 + uVar5 * 4);
    uVar3 = uVar1 / uVar2;
    uVar4 = uVar1;
    if (0xffff >= uVar3) {
      uVar4 = uVar1 % uVar2 << 0x10 | uVar3;
      (this->reg).sr.z = uVar2 <= uVar1;
      (this->reg).sr.n = 0x7fff < uVar3;
      (this->reg).sr.c = false;
    }
    (this->reg).sr.v = 0xffff < uVar3;
    *(uint *)((long)&(this->reg).field_3 + uVar5 * 4) = uVar4;
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = read<(moira::Core)0,(moira::AddrSpace)2,2,4ull>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    this->readBuffer = (u16)uVar2;
  }
  return;
}

Assistant:

void
Moira::execDivuMusashi(u16 opcode, bool *divByZero)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    [[maybe_unused]] i64 c = clock;
    u32 ea, divisor, result;
    readOp<C, M, Word>(src, &ea, &divisor);

    // Check for division by zero
    if (divisor == 0) {
        if constexpr (C == Core::C68000) {
            SYNC(8 - (int)(clock - c));
        } else {
            SYNC(10 - (int)(clock - c));
        }
        execException<C>(M68kException::DIVIDE_BY_ZERO);
        *divByZero = true;
        return;
    }

    u32 dividend = readD(dst);
    result = divuMusashi<C>(dividend, divisor);

    SYNC_68000(136);
    SYNC_68010(104);

    writeD(dst, result);
    prefetch<C, POLL>();
}